

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

qint64 __thiscall
QNetworkReplyFileImpl::readData(QNetworkReplyFileImpl *this,char *data,qint64 maxlen)

{
  bool bVar1;
  QNetworkReplyFileImplPrivate *pQVar2;
  ulong uVar3;
  QFile *pQVar4;
  long lVar5;
  longlong in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  qint64 ret;
  QNetworkReplyFileImplPrivate *d;
  QVariant *value;
  undefined1 in_stack_ffffffffffffff78 [16];
  qint64 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QNetworkReplyFileImpl *)0x1e77da);
  if ((((pQVar2->super_QNetworkReplyPrivate).isFinished & 1U) != 0) &&
     (bVar1 = QPointer::operator_cast_to_bool((QPointer<QFile> *)0x1e77fe), bVar1)) {
    QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7815);
    uVar3 = QIODevice::isOpen();
    if ((uVar3 & 1) != 0) {
      pQVar4 = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7840);
      local_50 = QIODevice::read((char *)pQVar4,in_RSI);
      lVar5 = (**(code **)(*in_RDI + 0xa0))();
      if (lVar5 == 0) {
        pQVar4 = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e787c);
        (**(code **)(*(long *)pQVar4 + 0x70))();
      }
      if ((local_50 == 0) && (lVar5 = (**(code **)(*in_RDI + 0xa0))(), lVar5 == 0)) {
        local_50 = -1;
      }
      else {
        QVariant::QVariant(&local_28,200);
        value = in_stack_ffffffffffffff78._0_8_;
        QNetworkReply::setAttribute
                  (in_stack_ffffffffffffff78._8_8_,(Attribute)((ulong)local_50 >> 0x20),value);
        QVariant::~QVariant(&local_28);
        QVar6 = Qt::Literals::StringLiterals::operator____L1((char *)value,(size_t)in_RDI);
        QVariant::QVariant(&local_48,(QLatin1String *)QVar6.m_size);
        QNetworkReply::setAttribute
                  ((QNetworkReply *)QVar6.m_data,(Attribute)((ulong)local_50 >> 0x20),
                   (QVariant *)QVar6.m_size);
        QVariant::~QVariant(&local_48);
      }
      goto LAB_001e7930;
    }
  }
  local_50 = -1;
LAB_001e7930:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

qint64 QNetworkReplyFileImpl::readData(char *data, qint64 maxlen)
{
    Q_D(QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return -1;
    qint64 ret = d->realFile->read(data, maxlen);
    if (bytesAvailable() == 0)
        d->realFile->close();
    if (ret == 0 && bytesAvailable() == 0)
        return -1;
    else {
        setAttribute(QNetworkRequest::HttpStatusCodeAttribute, 200);
        setAttribute(QNetworkRequest::HttpReasonPhraseAttribute, "OK"_L1);
        return ret;
    }
}